

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_15::XmlReporter::test_case_skipped(XmlReporter *this,TestCaseData *in)

{
  allocator<char> local_31;
  string local_30;
  
  if (this->opt->no_skipped_summary == false) {
    test_case_start_impl(this,in);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"skipped",&local_31);
    XmlWriter::writeAttribute(&this->xml,&local_30,"true");
    std::__cxx11::string::~string((string *)&local_30);
    XmlWriter::endElement(&this->xml);
  }
  return;
}

Assistant:

void test_case_skipped(const TestCaseData& in) override {
            if(opt.no_skipped_summary == false) {
                test_case_start_impl(in);
                xml.writeAttribute("skipped", "true");
                xml.endElement();
            }
        }